

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void check_labels(c2m_ctx_t c2m_ctx,node_t_conflict labels,node_t_conflict target)

{
  check_ctx *pcVar1;
  node_t_conflict n;
  type *type;
  long lVar2;
  int iVar3;
  uint uVar4;
  node_t_conflict pnVar5;
  undefined8 *puVar6;
  char *pcVar7;
  node_t case_expr;
  char *pcVar8;
  code *pcVar9;
  anon_union_16_10_0af5b411_for_u *paVar10;
  bool bVar11;
  pos_t pVar12;
  int *local_90;
  type_mode *local_88;
  undefined8 *local_80;
  symbol_t sym;
  
  pcVar1 = c2m_ctx->check_ctx;
  paVar10 = &labels->u;
  do {
    n = (paVar10->ops).head;
    if (n == (node_t_conflict)0x0) {
      return;
    }
    if (n->code == N_LABEL) {
      pnVar5 = (n->u).ops.head;
      iVar3 = symbol_find(c2m_ctx,S_LABEL,pnVar5,pcVar1->func_block_scope,&sym);
      if (iVar3 == 0) {
        symbol_insert(c2m_ctx,S_LABEL,pnVar5,pcVar1->func_block_scope,target,(node_t_conflict)0x0);
      }
      else {
        pVar12 = get_node_pos(c2m_ctx,pnVar5);
        pcVar8 = (pnVar5->u).s.s;
        pcVar7 = "label %s redeclaration";
LAB_0015937b:
        error(c2m_ctx,pcVar7,pVar12.fname,pVar12._8_8_,pcVar8);
      }
    }
    else {
      if (pcVar1->curr_switch == (node_t_conflict)0x0) {
        pVar12 = get_node_pos(c2m_ctx,n);
        pcVar8 = "default label";
        if (n->code == N_CASE) {
          pcVar8 = "case label";
        }
        pcVar7 = "%s not within a switch-stmt";
        goto LAB_0015937b;
      }
      type = (type *)pcVar1->curr_switch->attr;
      if (n->code == N_CASE) {
        case_expr = (n->u).ops.head;
        pnVar5 = DLIST_node_t_el(&(n->u).ops,1);
        local_80 = *(undefined8 **)&type[1].align;
        if (local_80 == (undefined8 *)0x0) {
          local_80 = (undefined8 *)0x0;
          bVar11 = false;
          if (case_expr == (node_t)0x0) goto LAB_001594ab;
        }
        else {
LAB_001593a1:
          bVar11 = *(int *)*local_80 == 0x51;
          if (case_expr == (node_t)0x0) {
            if (*(int *)*local_80 == 0x51) {
              pVar12 = get_node_pos(c2m_ctx,n);
              error(c2m_ctx,0x18d598,pVar12.fname,pVar12._8_8_);
              goto LAB_00159556;
            }
            bVar11 = false;
            goto LAB_001594ab;
          }
        }
        uVar4 = check_case_expr(c2m_ctx,case_expr,type,target);
        if (pnVar5 != (node_t_conflict)0x0) {
          iVar3 = check_case_expr(c2m_ctx,pnVar5,type,target);
          pcVar9 = error;
          uVar4 = (uint)(uVar4 != 0 && iVar3 != 0);
          if (c2m_ctx->options->pedantic_p == 0) {
            pcVar9 = warning;
          }
          pVar12 = get_node_pos(c2m_ctx,n);
          (*pcVar9)(c2m_ctx,pVar12.fname,pVar12._8_8_,"range cases are not a part of C standard");
        }
        if (uVar4 == 0) goto LAB_00159556;
      }
      else {
        local_80 = *(undefined8 **)&type[1].align;
        if (local_80 != (undefined8 *)0x0) {
          pnVar5 = (node_t_conflict)0x0;
          case_expr = (node_t)0x0;
          goto LAB_001593a1;
        }
        local_80 = (undefined8 *)0x0;
        bVar11 = false;
      }
LAB_001594ab:
      local_88 = &type[1].mode;
      local_90 = &type[1].align;
      puVar6 = (undefined8 *)reg_malloc(c2m_ctx,0x20);
      *puVar6 = n;
      puVar6[1] = target;
      if (bVar11) {
        if ((local_80 != (undefined8 *)0x0) && (*(long *)local_90 != 0)) {
          lVar2 = local_80[2];
          if (lVar2 == 0) {
            if (*(undefined8 **)local_88 == local_80) {
              local_80[2] = puVar6;
              puVar6[3] = local_80;
              puVar6[2] = 0;
              goto LAB_00159553;
            }
          }
          else if (*(undefined8 **)local_88 != (undefined8 *)0x0) {
            *(undefined8 **)(lVar2 + 0x18) = puVar6;
            puVar6[2] = lVar2;
            local_80[2] = puVar6;
            puVar6[3] = local_80;
            goto LAB_00159556;
          }
        }
        pcVar8 = "insert_before";
LAB_00159581:
        dlist_assert_fail(pcVar8,"case_t");
      }
      lVar2 = *(long *)local_90;
      if (lVar2 == 0) {
        if (*(long *)local_88 != 0) goto LAB_0015957a;
      }
      else {
        if (*(long *)(lVar2 + 0x18) != 0) {
LAB_0015957a:
          pcVar8 = "append";
          goto LAB_00159581;
        }
        local_88 = (type_mode *)(lVar2 + 0x18);
      }
      *(undefined8 **)local_88 = puVar6;
      puVar6[3] = 0;
      puVar6[2] = lVar2;
      local_88 = (type_mode *)local_90;
LAB_00159553:
      *(undefined8 **)local_88 = puVar6;
    }
LAB_00159556:
    paVar10 = (anon_union_16_10_0af5b411_for_u *)&(n->op_link).next;
  } while( true );
}

Assistant:

static void check_labels (c2m_ctx_t c2m_ctx, node_t labels, node_t target) {
  check_ctx_t check_ctx = c2m_ctx->check_ctx;

  for (node_t l = NL_HEAD (labels->u.ops); l != NULL; l = NL_NEXT (l)) {
    if (l->code == N_LABEL) {
      symbol_t sym;
      node_t id = NL_HEAD (l->u.ops);

      if (symbol_find (c2m_ctx, S_LABEL, id, func_block_scope, &sym)) {
        error (c2m_ctx, POS (id), "label %s redeclaration", id->u.s.s);
      } else {
        symbol_insert (c2m_ctx, S_LABEL, id, func_block_scope, target, NULL);
      }
    } else if (curr_switch == NULL) {
      error (c2m_ctx, POS (l), "%s not within a switch-stmt",
             l->code == N_CASE ? "case label" : "default label");
    } else {
      struct switch_attr *switch_attr = curr_switch->attr;
      struct type *type = &switch_attr->type;
      node_t case_expr = l->code == N_CASE ? NL_HEAD (l->u.ops) : NULL;
      node_t case_expr2 = l->code == N_CASE ? NL_EL (l->u.ops, 1) : NULL;
      case_t case_attr, tail = DLIST_TAIL (case_t, switch_attr->case_labels);
      int ok_p = FALSE, default_p = tail != NULL && tail->case_node->code == N_DEFAULT;

      if (case_expr == NULL) {
        if (default_p) {
          error (c2m_ctx, POS (l), "multiple default labels in one switch");
        } else {
          ok_p = TRUE;
        }
      } else {
        ok_p = check_case_expr (c2m_ctx, case_expr, type, target);
        if (case_expr2 != NULL) {
          ok_p = check_case_expr (c2m_ctx, case_expr2, type, target) && ok_p;
          (c2m_options->pedantic_p ? error : warning) (c2m_ctx, POS (l),
                                                       "range cases are not a part of C standard");
        }
      }
      if (ok_p) {
        case_attr = reg_malloc (c2m_ctx, sizeof (struct case_attr));
        case_attr->case_node = l;
        case_attr->case_target_node = target;
        if (default_p) {
          DLIST_INSERT_BEFORE (case_t, switch_attr->case_labels, tail, case_attr);
        } else {
          DLIST_APPEND (case_t, switch_attr->case_labels, case_attr);
        }
      }
    }
  }
}